

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcStatesPartials
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int local_90;
  int local_8c;
  double local_88;
  double local_80;
  int pad;
  int j;
  double sumB;
  double sumA;
  double tmp;
  double *matrices2Ptr;
  int i;
  int state1;
  int w;
  int k;
  double *destPtr;
  double *partials2Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  double *matrices2_local;
  double *partials2_local;
  double *matrices1_local;
  
  iVar4 = this->kStateCount + 1;
  iVar1 = this->kStateCount;
  for (destPtr._4_4_ = 0; destPtr._4_4_ < this->kCategoryCount; destPtr._4_4_ = destPtr._4_4_ + 1) {
    iVar3 = destPtr._4_4_ * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar2 = this->kMatrixSize;
    _i = partials2 + iVar3;
    matrices2Ptr = destP + iVar3;
    for (tmp._4_4_ = startPattern; tmp._4_4_ < endPattern; tmp._4_4_ = tmp._4_4_ + 1) {
      tmp._0_4_ = destPtr._4_4_ * this->kMatrixSize;
      iVar3 = states1[tmp._4_4_];
      for (sumA._0_4_ = 0; sumA._0_4_ < this->kStateCount; sumA._0_4_ = sumA._0_4_ + 1) {
        lVar6 = (long)(destPtr._4_4_ * iVar2);
        lVar7 = (long)(sumA._0_4_ * iVar4);
        iVar5 = tmp._0_4_ + iVar3;
        local_80 = 0.0;
        local_88 = 0.0;
        for (local_8c = 0; local_8c < iVar1 / 4 << 2; local_8c = local_8c + 4) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = matrices2[lVar6 + lVar7 + local_8c];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = _i[local_8c];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_80;
          auVar8 = vfmadd213sd_fma(auVar8,auVar13,auVar18);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = matrices2[lVar6 + lVar7 + (local_8c + 1)];
          auVar9._8_8_ = 0;
          auVar9._0_8_ = _i[local_8c + 1];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_88;
          auVar9 = vfmadd213sd_fma(auVar9,auVar14,auVar19);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = matrices2[lVar6 + lVar7 + (local_8c + 2)];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = _i[local_8c + 2];
          auVar20._8_8_ = 0;
          auVar20._0_8_ = auVar8._0_8_;
          auVar8 = vfmadd213sd_fma(auVar10,auVar15,auVar20);
          local_80 = auVar8._0_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = matrices2[lVar6 + lVar7 + (local_8c + 3)];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = _i[local_8c + 3];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = auVar9._0_8_;
          auVar8 = vfmadd213sd_fma(auVar11,auVar16,auVar21);
          local_88 = auVar8._0_8_;
        }
        for (; local_8c < this->kStateCount; local_8c = local_8c + 1) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = matrices2[lVar6 + lVar7 + local_8c];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = _i[local_8c];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_80;
          auVar8 = vfmadd213sd_fma(auVar12,auVar17,auVar22);
          local_80 = auVar8._0_8_;
        }
        tmp._0_4_ = iVar4 + tmp._0_4_;
        *matrices2Ptr = matrices1[iVar5] * (local_80 + local_88);
        matrices2Ptr = matrices2Ptr + 1;
      }
      for (local_90 = 0; local_90 < 1; local_90 = local_90 + 1) {
        *matrices2Ptr = 0.0;
        matrices2Ptr = matrices2Ptr + 1;
      }
      _i = _i + this->kPartialsPaddedStateCount;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}